

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixUtils.cpp
# Opt level: O3

HighsStatus
assessMatrix(HighsLogOptions *log_options,string *matrix_name,HighsInt vec_dim,HighsInt num_vec,
            vector<int,_std::allocator<int>_> *matrix_start,
            vector<int,_std::allocator<int>_> *matrix_p_end,
            vector<int,_std::allocator<int>_> *matrix_index,
            vector<double,_std::allocator<double>_> *matrix_value,double small_matrix_value,
            double large_matrix_value)

{
  pointer pcVar1;
  HighsStatus HVar2;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar1 = (matrix_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + matrix_name->_M_string_length);
  HVar2 = assessMatrix(log_options,&local_50,vec_dim,num_vec,false,matrix_start,matrix_p_end,
                       matrix_index,matrix_value,small_matrix_value,large_matrix_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return HVar2;
}

Assistant:

HighsStatus assessMatrix(const HighsLogOptions& log_options,
                         const std::string matrix_name, const HighsInt vec_dim,
                         const HighsInt num_vec, vector<HighsInt>& matrix_start,
                         vector<HighsInt>& matrix_p_end,
                         vector<HighsInt>& matrix_index,
                         vector<double>& matrix_value,
                         const double small_matrix_value,
                         const double large_matrix_value) {
  const bool partitioned = false;
  return assessMatrix(log_options, matrix_name, vec_dim, num_vec, partitioned,
                      matrix_start, matrix_p_end, matrix_index, matrix_value,
                      small_matrix_value, large_matrix_value);
}